

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall sfc::Image::Image(Image *this,Palette *palette)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  runtime_error *this_00;
  uint uVar4;
  uint uVar5;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  v;
  rgba_vec_t rgba_v;
  value_type vy;
  
  p_Var1 = &(this->_colors)._M_t._M_impl.super__Rb_tree_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Palette::normalized_colors(&v,palette);
  if ((v.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       v.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((v.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      ((v.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    uVar5 = palette->_max_colors_per_subpalette;
    this->_width = uVar5;
    uVar4 = (uint)(((long)v.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)v.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    this->_height = uVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_data,(ulong)(uVar5 * uVar4 * 4));
    puVar2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (puVar3 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      *puVar3 = '\0';
    }
    uVar5 = 0;
    while( true ) {
      if ((ulong)(((long)v.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)v.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar5) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &vy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 v.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5);
      uVar4 = 0;
      while( true ) {
        if ((ulong)((long)vy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)vy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                          .super__Vector_impl_data._M_start >> 2) <= (ulong)uVar4) break;
        set_pixel(this,(int)vy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4] >> 0x1f &
                       vy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4],uVar4,uVar5);
        uVar4 = uVar4 + 1;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&vy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      uVar5 = uVar5 + 1;
    }
    this->_src_coord_x = 0;
    this->_src_coord_y = 0;
    to_rgba(&rgba_v,&this->_data);
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&vy,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&(this->_colors)._M_t,
                (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&vy);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&vy);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&v);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"No colors");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Image::Image(const sfc::Palette& palette) {
  auto v = palette.normalized_colors();
  if (v.empty() || v[0].empty())
    throw std::runtime_error("No colors");

  _width = palette.max_colors_per_subpalette();
  _height = (unsigned)v.size();
  _data.resize(_width * _height * 4);
  std::fill(_data.begin(), _data.end(), 0);

  for (unsigned y = 0; y < v.size(); ++y) {
    auto vy = v[y];
    for (unsigned x = 0; x < vy.size(); ++x)
      set_pixel(sfc::rgba_color(vy[x]), x, y);
  }

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}